

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::BindingRenderCase::iterate(BindingRenderCase *this)

{
  bool bVar1;
  TestLog *log;
  undefined1 local_28 [8];
  Surface surface;
  BindingRenderCase *this_local;
  
  surface.m_pixels.m_cap = (size_t)this;
  tcu::Surface::Surface((Surface *)local_28,0x40,0x40);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,(Surface *)local_28);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  bVar1 = verifyImageYellowGreen((Surface *)local_28,log,false);
  if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else if ((this->m_unalignedData & 1U) == 0) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image verification failed");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_COMPATIBILITY_WARNING,"Failed to draw with unaligned data");
  }
  tcu::Surface::~Surface((Surface *)local_28);
  return STOP;
}

Assistant:

BindingRenderCase::IterateResult BindingRenderCase::iterate (void)
{
	tcu::Surface surface(TEST_RENDER_SIZE, TEST_RENDER_SIZE);

	// draw pattern

	renderTo(surface);

	// verify results

	if (verifyImageYellowGreen(surface, m_testCtx.getLog(), false))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else if (m_unalignedData)
		m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Failed to draw with unaligned data");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

	return STOP;
}